

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O2

WindowQuantileState<double> * __thiscall
duckdb::QuantileState<double,_duckdb::QuantileStandardType>::GetOrCreateWindowState
          (QuantileState<double,_duckdb::QuantileStandardType> *this)

{
  _Head_base<0UL,_duckdb::WindowQuantileState<double>_*,_false> __p;
  pointer in_RAX;
  type pWVar1;
  _Head_base<0UL,_duckdb::WindowQuantileState<double>_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  if ((this->window_state).
      super_unique_ptr<duckdb::WindowQuantileState<double>,_std::default_delete<duckdb::WindowQuantileState<double>_>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::WindowQuantileState<double>,_std::default_delete<duckdb::WindowQuantileState<double>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::WindowQuantileState<double>_*,_std::default_delete<duckdb::WindowQuantileState<double>_>_>
      .super__Head_base<0UL,_duckdb::WindowQuantileState<double>_*,_false>._M_head_impl ==
      (WindowQuantileState<double> *)0x0) {
    make_uniq<duckdb::WindowQuantileState<double>>();
    __p._M_head_impl = local_18._M_head_impl;
    local_18._M_head_impl = (pointer)0x0;
    ::std::
    __uniq_ptr_impl<duckdb::WindowQuantileState<double>,_std::default_delete<duckdb::WindowQuantileState<double>_>_>
    ::reset((__uniq_ptr_impl<duckdb::WindowQuantileState<double>,_std::default_delete<duckdb::WindowQuantileState<double>_>_>
             *)&this->window_state,__p._M_head_impl);
    ::std::
    unique_ptr<duckdb::WindowQuantileState<double>,_std::default_delete<duckdb::WindowQuantileState<double>_>_>
    ::~unique_ptr((unique_ptr<duckdb::WindowQuantileState<double>,_std::default_delete<duckdb::WindowQuantileState<double>_>_>
                   *)&local_18);
  }
  pWVar1 = unique_ptr<duckdb::WindowQuantileState<double>,_std::default_delete<duckdb::WindowQuantileState<double>_>,_true>
           ::operator*(&this->window_state);
  return pWVar1;
}

Assistant:

WindowQuantileState<INPUT_TYPE> &GetOrCreateWindowState() {
		if (!window_state) {
			window_state = make_uniq<WindowQuantileState<INPUT_TYPE>>();
		}
		return *window_state;
	}